

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall Chainstate::LoadChainTip(Chainstate *this)

{
  pointer ppCVar1;
  BlockManager *this_00;
  bool bVar2;
  bool bVar3;
  CCoinsViewCache *pCVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  double local_98;
  int local_8c;
  string local_88;
  base_blob<256U> local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = CoinsTip(this);
  (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_48,pCVar4);
  bVar2 = base_blob<256U>::IsNull((base_blob<256U> *)&local_48);
  if (bVar2) {
    __assert_fail("!coins_cache.GetBestBlock().IsNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x122c,"bool Chainstate::LoadChainTip()");
  }
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar1 !=
       (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (pCVar5 = ppCVar1[-1], pCVar5 != (CBlockIndex *)0x0)) {
    CBlockIndex::GetBlockHash((uint256 *)&local_48,pCVar5);
    (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_68,pCVar4);
    bVar2 = ::operator==((base_blob<256U> *)&local_48,&local_68);
    bVar3 = true;
    if (bVar2) goto LAB_008ba2f7;
  }
  this_00 = this->m_blockman;
  (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_48,pCVar4);
  pCVar5 = ::node::BlockManager::LookupBlockIndex(this_00,(uint256 *)&local_48);
  if (pCVar5 == (CBlockIndex *)0x0) {
    bVar3 = false;
  }
  else {
    CChain::SetTip(&this->m_chain,pCVar5);
    PruneBlockIndexCandidates(this);
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar5 = (CBlockIndex *)0x0;
    }
    else {
      pCVar5 = ppCVar1[-1];
    }
    CBlockIndex::GetBlockHash((uint256 *)&local_68,pCVar5);
    base_blob<256u>::ToString_abi_cxx11_(&local_48,(base_blob<256u> *)&local_68);
    local_8c = (int)((ulong)((long)(this->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    FormatISO8601DateTime_abi_cxx11_(&local_88,(ulong)pCVar5->nTime);
    local_98 = GuessVerificationProgress
                         (&((this->m_chainman->m_options).chainparams)->chainTxData,pCVar5);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "LoadChainTip";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<std::__cxx11::string,int,std::__cxx11::string,double>
              (logging_function,source_file,0x1240,ALL,Info,(ConstevalFormatString<4U>)0xcd2821,
               &local_48,&local_8c,&local_88,&local_98);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    bVar3 = true;
  }
LAB_008ba2f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::LoadChainTip()
{
    AssertLockHeld(cs_main);
    const CCoinsViewCache& coins_cache = CoinsTip();
    assert(!coins_cache.GetBestBlock().IsNull()); // Never called when the coins view is empty
    const CBlockIndex* tip = m_chain.Tip();

    if (tip && tip->GetBlockHash() == coins_cache.GetBestBlock()) {
        return true;
    }

    // Load pointer to end of best chain
    CBlockIndex* pindex = m_blockman.LookupBlockIndex(coins_cache.GetBestBlock());
    if (!pindex) {
        return false;
    }
    m_chain.SetTip(*pindex);
    PruneBlockIndexCandidates();

    tip = m_chain.Tip();
    LogPrintf("Loaded best chain: hashBestChain=%s height=%d date=%s progress=%f\n",
              tip->GetBlockHash().ToString(),
              m_chain.Height(),
              FormatISO8601DateTime(tip->GetBlockTime()),
              GuessVerificationProgress(m_chainman.GetParams().TxData(), tip));
    return true;
}